

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O0

void ugui_graphics_draw_text
               (ugui_graphics_t *graphics,char *text,font_style_t *font,ugui_point_t point)

{
  ugui_sprite_t sprite_00;
  size_t sVar1;
  ushort local_42;
  undefined1 auStack_40 [5];
  char c;
  uint16_t i;
  ugui_sprite_t sprite;
  uint16_t length;
  font_style_t *font_local;
  char *text_local;
  ugui_graphics_t *graphics_local;
  ugui_point_t point_local;
  
  sVar1 = strlen(text);
  sprite.data._6_2_ = (ushort)sVar1;
  graphics_local._4_4_ = point;
  for (local_42 = 0; local_42 < sprite.data._6_2_; local_42 = local_42 + 1) {
    _ugui_font_get_glyph(font,text[local_42],(ugui_sprite_t *)auStack_40);
    sprite_00.h = auStack_40._2_2_;
    sprite_00.w_bytes = stack0xffffffffffffffc4;
    sprite_00._6_2_ = i;
    sprite_00.data = (uint8_t *)sprite._0_8_;
    sprite_00.w = auStack_40._0_2_;
    ugui_graphics_draw_sprite(graphics,sprite_00,graphics_local._4_4_);
    graphics_local._4_4_ =
         (ugui_point_t)CONCAT22(graphics_local._6_2_,graphics_local._4_2_ + auStack_40._0_2_);
  }
  return;
}

Assistant:

void ugui_graphics_draw_text(ugui_graphics_t* graphics, char* text, font_style_t* font, ugui_point_t point)
{
	uint16_t length = strlen(text);
	ugui_sprite_t sprite;

	for (uint16_t i = 0; i < length; i++) {
		char c = text[i];
		_ugui_font_get_glyph(font, c, &sprite);
		ugui_graphics_draw_sprite(graphics, sprite, point);
		point.x += sprite.w;
	}
}